

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_reader.c
# Opt level: O0

lafe_line_reader * lafe_line_reader(char *pathname,int nullSeparator)

{
  int iVar1;
  lafe_line_reader *plVar2;
  char *pcVar3;
  FILE *pFVar4;
  uint *puVar5;
  int in_ESI;
  char *in_RDI;
  lafe_line_reader *lr;
  
  plVar2 = (lafe_line_reader *)calloc(1,0x48);
  if (plVar2 == (lafe_line_reader *)0x0) {
    lafe_errc(1,0xc,"Can\'t open %s",in_RDI);
  }
  plVar2->nullSeparator = in_ESI;
  pcVar3 = strdup(in_RDI);
  plVar2->pathname = pcVar3;
  iVar1 = strcmp(in_RDI,"-");
  if (iVar1 == 0) {
    plVar2->f = _stdin;
  }
  else {
    pFVar4 = fopen(in_RDI,"r");
    plVar2->f = (FILE *)pFVar4;
  }
  if (plVar2->f == (FILE *)0x0) {
    puVar5 = (uint *)__errno_location();
    lafe_errc(1,(int)(ulong)*puVar5,"Couldn\'t open %s",in_RDI);
  }
  plVar2->buff_length = 0x2000;
  plVar2->buff = (char *)0x0;
  plVar2->buff_end = (char *)0x0;
  plVar2->line_end = (char *)0x0;
  plVar2->line_start = (char *)0x0;
  return plVar2;
}

Assistant:

struct lafe_line_reader *
lafe_line_reader(const char *pathname, int nullSeparator)
{
	struct lafe_line_reader *lr;

	lr = calloc(1, sizeof(*lr));
	if (lr == NULL)
		lafe_errc(1, ENOMEM, "Can't open %s", pathname);

	lr->nullSeparator = nullSeparator;
	lr->pathname = strdup(pathname);

	if (strcmp(pathname, "-") == 0)
		lr->f = stdin;
	else
		lr->f = fopen(pathname, "r");
	if (lr->f == NULL)
		lafe_errc(1, errno, "Couldn't open %s", pathname);
	lr->buff_length = 8192;
	lr->line_start = lr->line_end = lr->buff_end = lr->buff = NULL;

	return (lr);
}